

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_util_assertion.hpp
# Opt level: O3

AssertionResult * __thiscall
iuutil::
CmpHelperEqIterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (AssertionResult *__return_storage_ptr__,iuutil *this,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> b1,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> e1,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> b2,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> e2)

{
  int iVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  iuStreamMessage *piVar7;
  AssertionResult *pAVar8;
  ulong uVar9;
  Message ar;
  int local_3b8;
  uint local_3b4;
  ios_base *local_3b0;
  AssertionResult *local_3a8;
  int *local_3a0;
  AssertionResult local_398;
  ulong local_370;
  iuutil *local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  AssertionResult local_340 [3];
  ios_base aiStack_2c0 [264];
  undefined1 local_1b8 [392];
  
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1b8);
  local_3b8 = 0;
  if (this == (iuutil *)b1._M_current) {
    uVar6 = 1;
LAB_001655b7:
    if (e1._M_current == b2._M_current) {
      if ((uVar6 & 1) != 0) {
        (__return_storage_ptr__->m_message)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_message).field_2;
        (__return_storage_ptr__->m_message)._M_string_length = 0;
        (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
        __return_storage_ptr__->m_result = true;
        goto LAB_001656ab;
      }
    }
    else {
      local_340[0].m_message._M_dataplus._M_p._0_4_ =
           local_3b8 +
           (int)((ulong)((long)b2._M_current + (0x3fffffffc - (long)e1._M_current)) >> 2) + 1;
      piVar7 = iutest::detail::iuStreamMessage::operator<<
                         ((iuStreamMessage *)local_1b8,(char (*) [21])"\nMismatch element : ");
      piVar7 = iutest::detail::iuStreamMessage::operator<<(piVar7,&local_3b8);
      piVar7 = iutest::detail::iuStreamMessage::operator<<(piVar7,(char (*) [5])" vs ");
      iutest::detail::iuStreamMessage::operator<<(piVar7,(int *)local_340);
    }
  }
  else {
    uVar9 = (long)b1._M_current + (-4 - (long)this);
    local_368 = (iuutil *)b1._M_current;
    if (e1._M_current == b2._M_current) {
      iVar5 = 1;
    }
    else {
      local_3b0 = aiStack_2c0;
      local_3b4 = (uint)CONCAT71((int7)((ulong)local_3b0 >> 8),1);
      iVar1 = local_3b8;
      local_3a8 = __return_storage_ptr__;
      local_3a0 = b2._M_current;
      do {
        local_3b8 = iVar1;
        iutest::internal::CmpHelperEQ<int,int>
                  (&local_398,(internal *)0x16f1ca,"",(char *)this,e1._M_current,e2._M_current);
        iutest::AssertionResult::operator!(local_340,&local_398);
        bVar4 = local_340[0].m_result;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340[0].m_message._M_dataplus._M_p != &local_340[0].m_message.field_2) {
          operator_delete(local_340[0].m_message._M_dataplus._M_p,
                          CONCAT71(local_340[0].m_message.field_2._M_allocated_capacity._1_7_,
                                   local_340[0].m_message.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398.m_message._M_dataplus._M_p != &local_398.m_message.field_2) {
          operator_delete(local_398.m_message._M_dataplus._M_p,
                          local_398.m_message.field_2._M_allocated_capacity + 1);
        }
        if (bVar4 != false) {
          piVar7 = iutest::detail::iuStreamMessage::operator<<
                             ((iuStreamMessage *)local_1b8,
                              (char (*) [25])"\nMismatch in a position ");
          piVar7 = iutest::detail::iuStreamMessage::operator<<(piVar7,&local_3b8);
          piVar7 = iutest::detail::iuStreamMessage::operator<<(piVar7,(char (*) [3])0x16ce2a);
          iutest::iu_global_format_stringstream::iu_global_format_stringstream
                    ((iu_global_format_stringstream *)local_340);
          local_370 = uVar9;
          std::ostream::operator<<(&local_340[0].m_message.field_2,*(int *)this);
          std::__cxx11::stringbuf::str();
          std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
          std::ios_base::~ios_base(local_3b0);
          piVar7 = iutest::detail::iuStreamMessage::operator<<(piVar7,&local_398.m_message);
          piVar7 = iutest::detail::iuStreamMessage::operator<<(piVar7,(char (*) [5])" vs ");
          iutest::iu_global_format_stringstream::iu_global_format_stringstream
                    ((iu_global_format_stringstream *)local_340);
          std::ostream::operator<<(&local_340[0].m_message.field_2,*e1._M_current);
          std::__cxx11::stringbuf::str();
          std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
          std::ios_base::~ios_base(local_3b0);
          iutest::detail::iuStreamMessage::operator<<(piVar7,&local_360);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_dataplus._M_p != &local_360.field_2) {
            operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398.m_message._M_dataplus._M_p != &local_398.m_message.field_2) {
            operator_delete(local_398.m_message._M_dataplus._M_p,
                            local_398.m_message.field_2._M_allocated_capacity + 1);
          }
          local_3b4 = 0;
          uVar9 = local_370;
        }
        this = this + 4;
        iVar1 = local_3b8 + 1;
        __return_storage_ptr__ = local_3a8;
        if (this == local_368) {
          e1._M_current = e1._M_current + 1;
          b2._M_current = local_3a0;
          local_3b8 = iVar1;
          uVar6 = local_3b4;
          goto LAB_001655b7;
        }
        e1._M_current = e1._M_current + 1;
        uVar9 = uVar9 - 4;
      } while (e1._M_current != local_3a0);
      iVar5 = local_3b8 + 2;
      local_3b8 = iVar1;
    }
    local_340[0].m_message._M_dataplus._M_p._0_4_ = (int)(uVar9 >> 2) + iVar5;
    piVar7 = iutest::detail::iuStreamMessage::operator<<
                       ((iuStreamMessage *)local_1b8,(char (*) [21])"\nMismatch element : ");
    piVar7 = iutest::detail::iuStreamMessage::operator<<(piVar7,(int *)local_340);
    piVar7 = iutest::detail::iuStreamMessage::operator<<(piVar7,(char (*) [5])" vs ");
    iutest::detail::iuStreamMessage::operator<<(piVar7,&local_3b8);
  }
  paVar2 = &local_340[0].m_message.field_2;
  local_340[0].m_message._M_string_length = 0;
  local_340[0].m_message.field_2._M_local_buf[0] = '\0';
  local_340[0].m_result = false;
  local_340[0].m_message._M_dataplus._M_p = (pointer)paVar2;
  pAVar8 = iutest::AssertionResult::operator<<(local_340,(iuStreamMessage *)local_1b8);
  (__return_storage_ptr__->m_message)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_message).field_2;
  pcVar3 = (pAVar8->m_message)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar3,pcVar3 + (pAVar8->m_message)._M_string_length);
  __return_storage_ptr__->m_result = pAVar8->m_result;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340[0].m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_340[0].m_message._M_dataplus._M_p,
                    CONCAT71(local_340[0].m_message.field_2._M_allocated_capacity._1_7_,
                             local_340[0].m_message.field_2._M_local_buf[0]) + 1);
  }
LAB_001656ab:
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  return __return_storage_ptr__;
}

Assistant:

::iutest::AssertionResult IUTEST_ATTRIBUTE_UNUSED_ CmpHelperEqIterator(T1 b1, T1 e1, T2 b2, T2 e2)
{
    int elem=0;
    bool result = true;
    ::iutest::Message ar;
    for(elem=0; b1 != e1 && b2 != e2; ++b1, ++b2, ++elem)
    {
        if(!::iutest::internal::backward::EqHelper<false>::Compare("", "", *b1, *b2))
        {
            result = false;
            ar << "\nMismatch in a position " << elem << ": "
                << ::iutest::internal::FormatForComparisonFailureMessage(*b1, *b2)
                << " vs " << ::iutest::internal::FormatForComparisonFailureMessage(*b2, *b1);
        }
    }
    if(b1 != e1)
    {
        int elem1 = elem;
        for(; b1 != e1; ++b1, ++elem1) {}
        result = false;
        ar << "\nMismatch element : " << elem1 << " vs " << elem;
    }
    if(b2 != e2)
    {
        int elem2 = elem;
        for(; b2 != e2; ++b2, ++elem2) {}
        result = false;
        ar << "\nMismatch element : " << elem << " vs " << elem2;
    }
    if( !result )
    {
        return ::iutest::AssertionFailure() << ar;
    }
    return ::iutest::AssertionSuccess();
}